

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool test_recursive(ilzham *lzham_dll,char *pPath,comp_options options)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  timer_ticks tVar4;
  size_type sVar5;
  undefined8 uVar6;
  char *__filename;
  FILE *pFVar7;
  __off64_t _Var8;
  undefined8 in_RSI;
  comp_options *in_stack_00000010;
  uint in_stack_00000018;
  undefined4 in_stack_0000001c;
  double total_elapsed_time;
  timer_ticks end_tick_count;
  int64 cmp_file_size;
  bool status;
  comp_options file_options;
  int64 src_file_size;
  FILE *pFile;
  string *src_file;
  uint file_index;
  char decomp_file [256];
  char cmp_file [256];
  uint unique_id;
  int first_file_index;
  timer_ticks start_tick_count;
  uint64 total_comp_size;
  uint64 total_source_size;
  uint total_files_compressed;
  string_array files;
  comp_options *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc30;
  allocator<char> *in_stack_fffffffffffffc50;
  undefined5 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5d;
  undefined1 in_stack_fffffffffffffc5e;
  undefined1 in_stack_fffffffffffffc5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  long local_320;
  undefined1 in_stack_fffffffffffffd07;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  string *in_stack_fffffffffffffd10;
  undefined4 uVar9;
  string *in_stack_fffffffffffffd18;
  comp_options *pcVar10;
  undefined8 local_2e0;
  uint local_2bc;
  char local_2b8 [24];
  comp_options *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  ilzham *in_stack_fffffffffffffd78;
  comp_options in_stack_fffffffffffffd90;
  char local_1b8 [256];
  uint local_b8;
  undefined4 local_b4;
  timer_ticks local_b0;
  long local_a8;
  long local_a0;
  uint local_94;
  undefined4 local_90;
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  undefined8 local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x113244);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,
             (char *)CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,
                                       CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58)
                                      )),in_stack_fffffffffffffc50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,
             (char *)CONCAT17(in_stack_fffffffffffffc5f,
                              CONCAT16(in_stack_fffffffffffffc5e,
                                       CONCAT15(in_stack_fffffffffffffc5d,in_stack_fffffffffffffc58)
                                      )),in_stack_fffffffffffffc50);
  bVar2 = find_files(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                     (string_array *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (bool)in_stack_fffffffffffffd07);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    local_94 = 0;
    local_a0 = 0;
    local_a8 = 0;
    local_b0 = timer::get_ticks();
    local_b4 = 0;
    tVar4 = timer::get_init_ticks();
    local_b8 = (uint)tVar4;
    sprintf(local_1b8,"__comp_temp_%u__.tmp",tVar4 & 0xffffffff);
    sprintf(local_2b8,"__decomp_temp_%u__.tmp",(ulong)local_b8);
    local_2bc = 0;
    while( true ) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_30);
      if (sVar5 <= local_2bc) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,(ulong)local_2bc);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_30);
      uVar6 = std::__cxx11::string::c_str();
      printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",(ulong)(local_2bc + 1),
             sVar5 & 0xffffffff,uVar6,local_1b8);
      __filename = (char *)std::__cxx11::string::c_str();
      pFVar7 = fopen64(__filename,"rb");
      if (pFVar7 == (FILE *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        printf("Skipping unreadable file \"%s\"\n",uVar6);
      }
      else {
        fseek(pFVar7,0,2);
        _Var8 = ftello64(pFVar7);
        fclose(pFVar7);
        bVar2 = ensure_file_is_writable(in_stack_fffffffffffffc28);
        if (!bVar2) {
          print_error("Unable to create file \"%s\"!\n",local_1b8);
          local_1 = 0;
          goto LAB_00113b63;
        }
        local_2e0 = (char *)CONCAT44(in_stack_0000001c,in_stack_00000018);
        pcVar10 = in_stack_00000010;
        if ((in_stack_00000018 & 0x1000000) != 0) {
          rand();
          uVar9 = SUB84(pcVar10,0);
          rand();
          iVar3 = rand();
          pcVar10 = (comp_options *)CONCAT44(iVar3 % 0x11,uVar9);
          iVar3 = rand();
          local_2e0._1_7_ = (undefined7)((ulong)local_2e0 >> 8);
          local_2e0 = (char *)(CONCAT71(local_2e0._1_7_,(char)iVar3) & 0xffffffffffffff01);
          iVar3 = rand();
          local_2e0 = (char *)(CONCAT53(local_2e0._3_5_,CONCAT12((char)iVar3,(undefined2)local_2e0))
                              & 0xffffffffff01ffff);
          iVar3 = rand();
          local_2e0 = (char *)(CONCAT26(local_2e0._6_2_,CONCAT15((char)iVar3,(undefined5)local_2e0))
                              & 0xffff01ffffffffff);
          comp_options::print(in_stack_fffffffffffffc20);
        }
        std::__cxx11::string::c_str();
        bVar2 = compress_streaming(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                   in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        if (!bVar2) {
          uVar6 = std::__cxx11::string::c_str();
          print_error("Failed compressing file \"%s\" to \"%s\"\n",uVar6,local_1b8);
          local_1 = 0;
          goto LAB_00113b63;
        }
        if (((ulong)local_2e0 & 0x100) != 0) {
          printf("Decompressing file \"%s\" to \"%s\"\n",local_1b8,local_2b8);
          in_stack_fffffffffffffc20 = pcVar10;
          bVar2 = ensure_file_is_writable(in_stack_fffffffffffffc28);
          if (!bVar2) {
            print_error("Unable to create file \"%s\"!\n",local_2b8);
            local_1 = 0;
            goto LAB_00113b63;
          }
          bVar2 = decompress_file(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                  in_stack_fffffffffffffd68,in_stack_fffffffffffffd90);
          if (!bVar2) {
            uVar6 = std::__cxx11::string::c_str();
            print_error("Failed decompressing file \"%s\" to \"%s\"\n",uVar6,local_2b8);
            local_1 = 0;
            goto LAB_00113b63;
          }
          uVar6 = std::__cxx11::string::c_str();
          printf("Comparing file \"%s\" to \"%s\"\n",local_2b8,uVar6);
          std::__cxx11::string::c_str();
          bVar2 = compare_files(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
          if (!bVar2) {
            uVar6 = std::__cxx11::string::c_str();
            print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
                        ,uVar6,local_1b8);
            local_1 = 0;
            goto LAB_00113b63;
          }
          printf("Decompressed file compared OK to original file.\n");
          in_stack_fffffffffffffc28 = local_2e0;
        }
        local_320 = 0;
        pFVar7 = fopen64(local_1b8,"rb");
        if (pFVar7 != (FILE *)0x0) {
          fseek(pFVar7,0,2);
          local_320 = ftello64(pFVar7);
          fclose(pFVar7);
        }
        local_94 = local_94 + 1;
        local_a0 = local_a0 + _Var8;
        local_a8 = local_a8 + local_320;
        printf("\n");
      }
      local_2bc = local_2bc + 1;
    }
    timer::get_ticks();
    dVar1 = timer::ticks_to_secs(0x113abf);
    printf("Test successful: %f secs\n",SUB84(dVar1,0));
    printf("Total files processed: %u\n",(ulong)local_94);
    printf("Total source size: %llu\n",local_a0);
    printf("Total compressed size: %llu\n",local_a8);
    remove(local_1b8);
    remove(local_2b8);
    local_1 = 1;
  }
  else {
    print_error("Failed finding files under path \"%s\"!\n",local_18);
    local_1 = 0;
  }
LAB_00113b63:
  local_90 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffc30);
  return (bool)(local_1 & 1);
}

Assistant:

static bool test_recursive(ilzham &lzham_dll, const char *pPath, comp_options options)
{
   string_array files;
   if (!find_files(pPath, "*", files, true))
   {
      print_error("Failed finding files under path \"%s\"!\n", pPath);
      return false;
   }

   uint total_files_compressed = 0;
   uint64 total_source_size = 0;
   uint64 total_comp_size = 0;

#ifdef WIN32
   MEMORYSTATUS initial_mem_status;
   GlobalMemoryStatus(&initial_mem_status);
#endif

   timer_ticks start_tick_count = timer::get_ticks();

   const int first_file_index = 0;

   uint unique_id = static_cast<uint>(timer::get_init_ticks());
   char cmp_file[256], decomp_file[256];

#ifdef _XBOX
   sprintf(cmp_file, "e:\\__comp_temp_%u__.tmp", unique_id);
   sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", unique_id);
#else
   sprintf(cmp_file, "__comp_temp_%u__.tmp", unique_id);
   sprintf(decomp_file, "__decomp_temp_%u__.tmp", unique_id);
#endif

   for (uint file_index = first_file_index; file_index < files.size(); file_index++)
   {
      const std::string &src_file = files[file_index];

      printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n", 1 + file_index, (uint)files.size(), src_file.c_str(), cmp_file);

      FILE *pFile = fopen(src_file.c_str(), "rb");
      if (!pFile)
      {
         printf("Skipping unreadable file \"%s\"\n", src_file.c_str());
         continue;
      }
      fseek(pFile, 0, SEEK_END);
      int64 src_file_size = _ftelli64(pFile);
      fclose(pFile);

      if (!ensure_file_is_writable(cmp_file))
      {
         print_error("Unable to create file \"%s\"!\n", cmp_file);
         return false;
      }

      comp_options file_options(options);
      if (options.m_randomize_params)
      {
         file_options.m_comp_level = static_cast<lzham_compress_level>(rand() % LZHAM_TOTAL_COMP_LEVELS);
         file_options.m_dict_size_log2 = LZHAM_MIN_DICT_SIZE_LOG2 + (rand() % (LZHAMTEST_MAX_POSSIBLE_DICT_SIZE - LZHAM_MIN_DICT_SIZE_LOG2 + 1));
         file_options.m_max_helper_threads = rand() % (LZHAM_MAX_HELPER_THREADS + 1);
         file_options.m_unbuffered_decompression = (rand() & 1) != 0;
#if !LZHAMTEST_NO_RANDOM_EXTREME_PARSING
         file_options.m_extreme_parsing = (rand() & 1) != 0;
#endif
         file_options.m_force_polar_codes = (rand() & 1) != 0;
         file_options.m_deterministic_parsing = (rand() & 1) != 0;

         file_options.print();
      }

      bool status = compress_streaming(lzham_dll, src_file.c_str(), cmp_file, file_options);
      if (!status)
      {
         print_error("Failed compressing file \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file);
         return false;
      }

      if (file_options.m_verify_compressed_data)
      {
         printf("Decompressing file \"%s\" to \"%s\"\n", cmp_file, decomp_file);

         if (!ensure_file_is_writable(decomp_file))
         {
            print_error("Unable to create file \"%s\"!\n", decomp_file);
            return false;
         }

         status = decompress_file(lzham_dll, cmp_file, decomp_file, file_options);
         if (!status)
         {
            print_error("Failed decompressing file \"%s\" to \"%s\"\n", src_file.c_str(), decomp_file);
            return false;
         }

         printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

         if (!compare_files(decomp_file, src_file.c_str()))
         {
            print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file);
            return false;
         }
         else
         {
            printf("Decompressed file compared OK to original file.\n");
         }
      }

      int64 cmp_file_size = 0;
      pFile = fopen(cmp_file, "rb");
      if (pFile)
      {
         fseek(pFile, 0, SEEK_END);
         cmp_file_size = _ftelli64(pFile);
         fclose(pFile);
      }

      total_files_compressed++;
      total_source_size += src_file_size;
      total_comp_size += cmp_file_size;

#ifdef WIN32
      MEMORYSTATUS mem_status;
      GlobalMemoryStatus(&mem_status);

#ifdef _XBOX
      const int64 bytes_allocated = initial_mem_status.dwAvailPhys - mem_status.dwAvailPhys;
#else
      const int64 bytes_allocated = initial_mem_status.dwAvailVirtual- mem_status.dwAvailVirtual;
#endif

      printf("Memory allocated relative to first file: %I64i\n", bytes_allocated);
#endif

      printf("\n");
   }

   timer_ticks end_tick_count = timer::get_ticks();

   double total_elapsed_time = timer::ticks_to_secs(end_tick_count - start_tick_count);

   printf("Test successful: %f secs\n", total_elapsed_time);
   printf("Total files processed: %u\n", total_files_compressed);
   printf("Total source size: " QUAD_INT_FMT "\n", total_source_size);
   printf("Total compressed size: " QUAD_INT_FMT "\n", total_comp_size);

   remove(cmp_file);
   remove(decomp_file);

   return true;
}